

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

int xmlSchemaResolveAttrUseProhibReferences
              (xmlSchemaAttributeUseProhibPtr prohib,xmlSchemaParserCtxtPtr pctxt)

{
  xmlSchemaAttributePtr_conflict pxVar1;
  xmlSchemaParserCtxtPtr pctxt_local;
  xmlSchemaAttributeUseProhibPtr prohib_local;
  
  pxVar1 = xmlSchemaGetAttributeDecl(pctxt->schema,prohib->name,prohib->targetNamespace);
  if (pxVar1 == (xmlSchemaAttributePtr_conflict)0x0) {
    xmlSchemaPResCompAttrErr
              (pctxt,XML_SCHEMAP_SRC_RESOLVE,(xmlSchemaBasicItemPtr)0x0,prohib->node,"ref",
               prohib->name,prohib->targetNamespace,XML_SCHEMA_TYPE_ATTRIBUTE,(char *)0x0);
    prohib_local._4_4_ = 0xbbc;
  }
  else {
    prohib_local._4_4_ = 0;
  }
  return prohib_local._4_4_;
}

Assistant:

static int
xmlSchemaResolveAttrUseProhibReferences(xmlSchemaAttributeUseProhibPtr prohib,
				       xmlSchemaParserCtxtPtr pctxt)
{
    if (xmlSchemaGetAttributeDecl(pctxt->schema, prohib->name,
	prohib->targetNamespace) == NULL) {

	xmlSchemaPResCompAttrErr(pctxt,
	    XML_SCHEMAP_SRC_RESOLVE,
	    NULL, prohib->node,
	    "ref", prohib->name, prohib->targetNamespace,
	    XML_SCHEMA_TYPE_ATTRIBUTE, NULL);
	return(XML_SCHEMAP_SRC_RESOLVE);
    }
    return(0);
}